

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

file_time_type ghc::filesystem::last_write_time(path *p,error_code *ec)

{
  bool bVar1;
  error_code *in_RSI;
  file_status fs;
  time_t result;
  uintmax_t *in_stack_000000a8;
  uintmax_t *in_stack_000000b0;
  file_status *in_stack_000000b8;
  error_code *in_stack_000000c0;
  path *in_stack_000000c8;
  time_t *in_stack_000000e0;
  int in_stack_000000e8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  file_status in_stack_ffffffffffffffd8;
  duration local_8;
  
  std::error_code::clear
            ((error_code *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  detail::status_ex(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,
                    in_stack_000000a8,in_stack_000000e0,in_stack_000000e8);
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    local_8.__r = (rep)std::chrono::
                       time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       ::min();
  }
  else {
    local_8.__r = (rep)std::chrono::_V2::system_clock::from_time_t
                                 ((time_t)in_stack_ffffffffffffffd8);
  }
  file_status::~file_status((file_status *)&stack0xffffffffffffffd8);
  return (file_time_type)(duration)local_8.__r;
}

Assistant:

GHC_INLINE file_time_type last_write_time(const path& p, std::error_code& ec) noexcept
{
    time_t result = 0;
    ec.clear();
    file_status fs = detail::status_ex(p, ec, nullptr, nullptr, nullptr, &result);
    return ec ? (file_time_type::min)() : std::chrono::system_clock::from_time_t(result);
}